

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

auto_arima_object auto_arima_init(int *pdqmax,int *PDQmax,int s,int r,int N)

{
  int iVar1;
  auto_arima_object paVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  
  iVar13 = 2;
  if (pdqmax == (int *)0x0) {
    uVar12 = 5;
    iVar11 = 2;
    iVar7 = 5;
  }
  else {
    uVar12 = (ulong)(uint)*pdqmax;
    iVar11 = pdqmax[1];
    iVar7 = pdqmax[2];
  }
  if (PDQmax == (int *)0x0) {
    iVar8 = 1;
    iVar9 = 2;
  }
  else {
    iVar13 = *PDQmax;
    iVar8 = PDQmax[1];
    iVar9 = PDQmax[2];
  }
  if ((((0 < N) && (iVar10 = (int)uVar12, -1 < iVar10)) && (-1 < iVar11)) &&
     (((-1 < iVar7 && (-1 < iVar13)) && ((-1 < iVar8 && (-1 < iVar9)))))) {
    iVar4 = iVar7 + iVar10;
    iVar5 = iVar4 + iVar13 + iVar9;
    iVar1 = r + 2 + iVar5;
    iVar6 = iVar1 + N;
    lVar3 = (long)iVar1;
    paVar2 = (auto_arima_object)malloc((lVar3 * lVar3 + (long)iVar6) * 8 + 0x150);
    paVar2->pmax = iVar10;
    paVar2->dmax = iVar11;
    paVar2->qmax = iVar7;
    paVar2->N = N;
    paVar2->s = s;
    paVar2->Pmax = iVar13;
    paVar2->Dmax = iVar8;
    paVar2->Qmax = iVar9;
    paVar2->M = r + 2;
    paVar2->r = r;
    paVar2->retval = 0;
    paVar2->start = 0;
    paVar2->verbose = 0;
    iVar11 = iVar1 * iVar1;
    if (iVar6 + iVar11 != 0 && SCARRY4(iVar6,iVar11) == iVar6 + iVar11 < 0) {
      memset(paVar2 + 1,0,(ulong)(r + N + iVar13 + iVar9 + iVar4 + iVar11 + 1) * 8 + 8);
    }
    paVar2->phi = (double *)(paVar2 + 1);
    paVar2->theta = (double *)(&paVar2[1].N + uVar12 * 2);
    paVar2->PHI = (double *)(&paVar2[1].N + (long)iVar4 * 2);
    paVar2->THETA = (double *)(&paVar2[1].N + (long)(iVar4 + iVar13) * 2);
    paVar2->exog = (double *)(&paVar2[1].N + (long)iVar5 * 2);
    paVar2->res = (double *)(&paVar2[1].N + lVar3 * 2);
    paVar2->vcov = (double *)(&paVar2[1].N + (long)iVar6 * 2);
    paVar2->method = 0;
    paVar2->optmethod = 5;
    paVar2->mean = 0.0;
    paVar2->var = 1.0;
    paVar2->lvcov = iVar11;
    paVar2->ncoeff = iVar1;
    paVar2->stepwise = 1;
    paVar2->num_models = 0x5e;
    paVar2->stationary = 0;
    paVar2->approximation = (uint)(0xc < s || 0x96 < N);
    paVar2->seasonal = 1;
    paVar2->Order_max = 5;
    paVar2->alpha_test = 0.05;
    paVar2->alpha_seas = 0.05;
    paVar2->imean = 1;
    paVar2->idrift = 1;
    builtin_strncpy(paVar2->test,"kpss",5);
    builtin_strncpy(paVar2->seas,"seas",5);
    builtin_strncpy(paVar2->information_criteria,"aicc",5);
    builtin_strncpy(paVar2->type,"level",6);
    paVar2->p_start = 2;
    paVar2->q_start = 2;
    paVar2->P_start = 1;
    paVar2->Q_start = 1;
    paVar2->Q = 0;
    paVar2->P = 0;
    paVar2->D = 0;
    paVar2->q = 0;
    paVar2->p = 0;
    paVar2->d = 0;
    paVar2->aicc = 0.0;
    paVar2->aic = 0.0;
    paVar2->bic = 0.0;
    return paVar2;
  }
  puts("\n Input Values cannot be Negative. Program Exiting. ");
  exit(-1);
}

Assistant:

auto_arima_object auto_arima_init(int *pdqmax,int *PDQmax,int s, int r, int N) {
	auto_arima_object obj = NULL;
	int pmax,dmax,qmax,Pmax,Dmax,Qmax;
	int i,ncxreg;

	if (pdqmax == NULL) {
		pmax = 5;
		dmax = 2;
		qmax = 5;
	} else {
		pmax = pdqmax[0];
		dmax = pdqmax[1];
		qmax = pdqmax[2];
	}

	if (PDQmax == NULL) {
		Pmax = 2;
		Dmax = 1;
		Qmax = 2;
	} else {
		Pmax = PDQmax[0];
		Dmax = PDQmax[1];
		Qmax = PDQmax[2];
	}

	ncxreg = r + 2;
	if (pmax < 0 || dmax < 0 || qmax < 0 || N <= 0 || Pmax < 0 || Dmax < 0 || Qmax < 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}

	obj = (auto_arima_object)malloc(sizeof(struct auto_arima_set) +
	 sizeof(double)* (pmax + qmax + Pmax + Qmax + ncxreg + N) + sizeof(double)* (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg ));

	obj->pmax = pmax;
	obj->dmax = dmax;
	obj->qmax = qmax;
	obj->N = N;
	obj->s = s;
	obj->Pmax = Pmax;
	obj->Dmax = Dmax;
	obj->Qmax = Qmax;
	obj->M = ncxreg;
	obj->r = r;
	obj->retval = 0;
	obj->start = 0;
	obj->verbose = 0;

	for(i = 0; i < (pmax + qmax + Pmax + Qmax + ncxreg + N) + (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg ); ++i ) {
		obj->params[i] = 0.0;
	}

	obj->phi = &obj->params[0];
	obj->theta = &obj->params[pmax];
	obj->PHI = &obj->params[pmax + qmax];
	obj->THETA = &obj->params[pmax + qmax + Pmax];
	obj->exog = &obj->params[pmax + qmax + Pmax + Qmax];
	obj->res = &obj->params[pmax + qmax + Pmax + Qmax + ncxreg];
	obj->vcov = &obj->params[pmax + qmax + Pmax + Qmax + ncxreg + N];


	obj->method = 0;// 0 - MLE, 1 - CSS, 2 - Box-Jenkins
	obj->optmethod = 5; // Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;
	obj->lvcov = (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg );
	obj->ncoeff = pmax + qmax + Pmax + Qmax + ncxreg ;

	// Set Default Values

	obj->stepwise = 1;
	obj->stationary = 0;
	obj->approximation = (N > 150 || s >  12) ? 1 : 0;
	//obj->approximation = 0;
	obj->Order_max = 5;
	obj->seasonal = 1;
	obj->num_models = 94;
	obj->alpha_test = 0.05;
	obj->alpha_seas = 0.05;
	obj->imean = 1;
	obj->idrift = 1;

	strcpy(obj->test,"kpss");
	strcpy(obj->seas,"seas");
	strcpy(obj->information_criteria,"aicc");
	strcpy(obj->type,"level");

	obj->p_start = 2;
	obj->q_start = 2;
	obj->P_start = 1;
	obj->Q_start = 1;
	
	// Temporary Init
	
	obj->p = obj->d = obj->q = obj->P = obj->D = obj->Q = 0;
	obj->aic = obj->bic = obj->aicc = 0;


	return obj;
}